

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Int __thiscall Json::Value::asInt(Value *this)

{
  double dVar1;
  int iVar2;
  uint uVar3;
  
  uVar3 = (uint)(byte)this->field_0x8;
  switch(this->field_0x8) {
  case 0:
    break;
  case 1:
    uVar3 = (this->value_).int_;
    break;
  case 2:
    uVar3 = (this->value_).uint_;
    if (0x7ffffffe < uVar3) {
      jbcoin::Throw<std::runtime_error,char_const(&)[36]>
                ((char (*) [36])"integer out of signed integer range");
    }
    break;
  case 3:
    dVar1 = (this->value_).real_;
    if ((dVar1 < -2147483648.0) || (2147483647.0 < dVar1)) {
      jbcoin::Throw<std::runtime_error,char_const(&)[33]>
                ((char (*) [33])"Real out of signed integer range");
    }
    uVar3 = (uint)dVar1;
    break;
  case 4:
    iVar2 = beast::lexicalCastThrow<int,char*>((this->value_).string_);
    return iVar2;
  case 5:
    uVar3 = (uint)(this->value_).bool_;
    break;
  case 6:
  case 7:
    jbcoin::Throw<std::runtime_error,char_const(&)[31]>
              ((char (*) [31])"Type is not convertible to int");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/json/impl/json_value.cpp"
                  ,0x23b,"Value::Int Json::Value::asInt() const");
  }
  return uVar3;
}

Assistant:

Value::Int
Value::asInt () const
{
    switch ( type_ )
    {
    case nullValue:
        return 0;

    case intValue:
        return value_.int_;

    case uintValue:
        JSON_ASSERT_MESSAGE ( value_.uint_ < (unsigned)maxInt, "integer out of signed integer range" );
        return value_.uint_;

    case realValue:
        JSON_ASSERT_MESSAGE ( value_.real_ >= minInt  &&  value_.real_ <= maxInt, "Real out of signed integer range" );
        return Int ( value_.real_ );

    case booleanValue:
        return value_.bool_ ? 1 : 0;

    case stringValue:
        return beast::lexicalCastThrow <int> (value_.string_);

    case arrayValue:
    case objectValue:
        JSON_ASSERT_MESSAGE ( false, "Type is not convertible to int" );

    default:
        JSON_ASSERT_UNREACHABLE;
    }

    return 0; // unreachable;
}